

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_test.cpp
# Opt level: O2

void check_all(void)

{
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  runtime_error *this;
  size_t sVar4;
  string local_1b0 [32];
  ostringstream oss;
  
  lVar2 = 0;
  do {
    if (lVar2 == 100) {
      return;
    }
    if (memory[lVar2] != (void *)0x0) {
      sVar4 = 0;
      while (sizes[lVar2] != sVar4) {
        pcVar1 = (char *)((long)memory[lVar2] + sVar4);
        sVar4 = sVar4 + 1;
        if (*pcVar1 != vals[lVar2]) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar3 = std::operator<<((ostream *)&oss,"Error ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/allocator_test.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x23);
          std::operator<<(poVar3," s[j]==c");
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(this,local_1b0);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void check_all()
{
	for(size_t pos = 0;pos < objects;pos++) {
		if(!memory[pos])
			continue;
		char c=vals[pos];
		size_t size = sizes[pos]; 
		char *s = static_cast<char *>(memory[pos]);
		for(size_t j=0;j<size;j++) {
			TEST(s[j]==c);
		}
	}
}